

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O1

int testSpanTestsIterationMultipleDims(void)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  pointer ptVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  undefined4 *puVar11;
  IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator> *pIVar12;
  pointer ptVar13;
  bool bVar14;
  bool bVar15;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  vector<int,_std::allocator<int>_> values;
  vector<int,_std::allocator<int>_> expectedRowSums;
  Span<const_int,_18446744073709551615UL> span2d;
  Span<const_int,_18446744073709551615UL> span;
  vector<int,_std::allocator<int>_> local_120;
  ulong local_108;
  pointer local_100;
  ulong local_f8;
  pointer local_f0;
  vector<int,_std::allocator<int>_> local_e8;
  IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator> local_d0;
  Span<const_int,_18446744073709551615UL> local_b0;
  IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>
  local_a0 [3];
  Span<const_int,_18446744073709551615UL> local_40;
  
  puVar11 = &DAT_003bae7c;
  pIVar12 = local_a0;
  for (lVar6 = 0x18; lVar6 != 0; lVar6 = lVar6 + -1) {
    *(undefined4 *)&(pIVar12->m_begin).m_ptr = *puVar11;
    puVar11 = puVar11 + 1;
    pIVar12 = (IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>
               *)((long)&(pIVar12->m_begin).m_ptr + 4);
  }
  __l._M_len = 0x18;
  __l._M_array = (iterator)local_a0;
  std::vector<int,_std::allocator<int>_>::vector(&local_120,__l,(allocator_type *)&local_d0);
  local_a0[0].m_begin.m_ptr = (pointer)0x1a0000000a;
  local_a0[0].m_begin.m_stride._0_4_ = 0x2a;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_a0;
  std::vector<int,_std::allocator<int>_>::vector(&local_e8,__l_00,(allocator_type *)&local_d0);
  local_40.m_ptr = (pointer)0x0;
  if ((long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    local_40.m_ptr =
         local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
  }
  local_40.m_size.m_size =
       (long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish -
       (long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start >> 2;
  MILBlob::Util::Span<const_int,_18446744073709551615UL>::IterateSlices
            (local_a0,&local_40,local_40.m_size.m_size >> 1);
  uVar2 = CONCAT44(local_a0[0].m_begin.m_stride._4_4_,(undefined4)local_a0[0].m_begin.m_stride);
  local_108 = local_a0[0].m_end.m_stride ^ uVar2;
  local_100 = local_a0[0].m_end.m_ptr;
  bVar1 = local_a0[0].m_begin.m_ptr != local_a0[0].m_end.m_ptr || local_108 != 0;
  ptVar7 = local_a0[0].m_begin.m_ptr;
  bVar14 = bVar1;
  if (local_a0[0].m_begin.m_ptr == local_a0[0].m_end.m_ptr && local_108 == 0) {
LAB_001ecf83:
    uVar9 = (uint)bVar1;
  }
  else {
    do {
      uVar9 = (uint)bVar14;
      local_b0.m_ptr = ptVar7;
      if (uVar2 == 0) {
        local_b0.m_ptr = (pointer)0x0;
      }
      local_b0.m_size.m_size = uVar2;
      if (uVar2 != 0xc) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                   ,0x69);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x284);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"(span2d.Size()) == (size_t(12))",0x1f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        goto LAB_001ecf83;
      }
      MILBlob::Util::Span<const_int,_18446744073709551615UL>::IterateSlices(&local_d0,&local_b0,4);
      sVar3 = local_d0.m_begin.m_stride;
      local_f8 = local_d0.m_end.m_stride ^ local_d0.m_begin.m_stride;
      local_f0 = local_d0.m_end.m_ptr;
      bVar14 = local_d0.m_begin.m_ptr == local_d0.m_end.m_ptr && local_f8 == 0;
      if (local_d0.m_begin.m_ptr != local_d0.m_end.m_ptr || local_f8 != 0) {
        lVar6 = local_d0.m_begin.m_stride * 4;
        lVar10 = 0;
        ptVar13 = local_d0.m_begin.m_ptr;
        do {
          if (sVar3 == 4) {
            lVar8 = 0;
            iVar4 = 0;
            do {
              iVar4 = iVar4 + *(int *)((long)ptVar13 + lVar8);
              lVar8 = lVar8 + 4;
            } while (lVar6 - lVar8 != 0);
            lVar8 = lVar10 + 1;
            bVar15 = iVar4 == local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar10];
            if (!bVar15) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                         ,0x69);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x28f);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5,"(sum) == (expectedRowSums[rowIndex++])",0x26);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5," was false, expected true.",0x1a);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
              std::ostream::put((char)poVar5);
              std::ostream::flush();
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                       ,0x69);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x288);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"(row.Size()) == (size_t(4))",0x1b);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5," was false, expected true.",0x1a);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            bVar15 = false;
            lVar8 = lVar10;
          }
          if (!bVar15) {
            if (!bVar14) goto LAB_001ecf85;
            break;
          }
          ptVar13 = ptVar13 + sVar3;
          bVar14 = ptVar13 == local_f0 && local_f8 == 0;
          lVar10 = lVar8;
        } while (ptVar13 != local_f0 || local_f8 != 0);
      }
      ptVar7 = ptVar7 + 0xc;
      bVar14 = ptVar7 != local_100 || local_108 != 0;
      uVar9 = (uint)bVar14;
    } while (ptVar7 != local_100 || local_108 != 0);
  }
LAB_001ecf85:
  if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return uVar9;
}

Assistant:

int testSpanTestsIterationMultipleDims()
{
    // clang-format off
    const std::vector<int> values = {
        // shape: [2, 3, 4]
        /*0*/
        1, 2, 3, 4,
        5, 6, 7, 8,
        9, 10, 11, 12,
        /*1*/
        1, 2, 3, 4,
        5, 6, 7, 8,
        9, 10, 11, 12
    };
    // clang-format on

    const std::vector<int> expectedRowSums = {10, 26, 42};

    auto span = MakeSpan(values);

    for (auto span2d : span.IterateByDimension(2)) {
        ML_ASSERT_EQ(span2d.Size(), size_t(12));

        size_t rowIndex = 0;
        for (auto row : span2d.IterateByDimension(3)) {
            ML_ASSERT_EQ(row.Size(), size_t(4));

            int sum = 0;
            for (auto i : row) {
                sum += i;
            }

            ML_ASSERT_EQ(sum, expectedRowSums[rowIndex++]);
        }
    }

    return 0;
}